

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteGeometryLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<library_geometries>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  for (pIndex = 0; pIndex < this->mScene->mNumMeshes; pIndex = pIndex + 1) {
    WriteGeometry(this,pIndex);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</library_geometries>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteGeometryLibrary()
{
    mOutput << startstr << "<library_geometries>" << endstr;
    PushTag();

    for( size_t a = 0; a < mScene->mNumMeshes; ++a)
        WriteGeometry( a);

    PopTag();
    mOutput << startstr << "</library_geometries>" << endstr;
}